

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

CMbuffer cm_extend_data_buf(CManager_conflict cm,CMbuffer tmp,size_t length)

{
  void *pvVar1;
  
  if (tmp->size < length) {
    pvVar1 = INT_CMrealloc(tmp->buffer,length);
    if (pvVar1 == (void *)0x0) {
      tmp = (CMbuffer)0x0;
    }
    else {
      tmp->buffer = pvVar1;
      tmp->size = length;
    }
  }
  return tmp;
}

Assistant:

extern CMbuffer
 cm_extend_data_buf(CManager cm, CMbuffer tmp, size_t length)  
 {
     (void)cm;
     if (tmp->size < length) {
	 char *t = INT_CMrealloc(tmp->buffer, length);
	 if (t == NULL) {
	     return NULL;
	 }
	 tmp->buffer = t;
	 tmp->size = length;
     }
     return tmp;
 }